

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_object_armor(parser *p)

{
  wchar_t wVar1;
  void *pvVar2;
  random_conflict rVar3;
  undefined8 local_30;
  undefined8 local_28;
  object_kind *k;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"ac");
    *(wchar_t *)((long)pvVar2 + 0x6c) = wVar1;
    rVar3 = parser_getrand(p,"to-a");
    local_30 = rVar3._0_8_;
    *(undefined8 *)((long)pvVar2 + 0x5c) = local_30;
    local_28 = rVar3._8_8_;
    *(undefined8 *)((long)pvVar2 + 100) = local_28;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_object_armor(struct parser *p) {
	struct object_kind *k = parser_priv(p);

	if (!k) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	k->ac = parser_getint(p, "ac");
	k->to_a = parser_getrand(p, "to-a");
	return PARSE_ERROR_NONE;
}